

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_deltaeta
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q1_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q1_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q2_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q2_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q3_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q3_imag,int flag,int flag_ch,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *corr_rap,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *corr_rap_err)

{
  pretty_ostream *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  pointer pvVar11;
  pointer pvVar12;
  pointer pvVar13;
  pointer pvVar14;
  pointer pvVar15;
  pointer pvVar16;
  pointer pvVar17;
  pointer pvVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  void *__s;
  long lVar22;
  pointer pvVar23;
  pointer pvVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  string local_50;
  
  uVar4 = this->N_rap;
  uVar31 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar4) {
    uVar31 = (long)(int)uVar4 * 8;
  }
  __s = operator_new__(uVar31);
  iVar5 = this->num_corr;
  if (0 < (long)iVar5) {
    uVar31 = (ulong)uVar4;
    iVar6 = this->order_max;
    pvVar7 = (event_Q2_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Q2_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (event_Q3_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (event_Q3_imag->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (corr_rap->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (corr_rap_err->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar21 = uVar31 * 0x18;
    lVar26 = 0;
    do {
      lVar34 = (long)(int)(&DAT_0014fbd0)[lVar26];
      lVar35 = (long)(int)(&DAT_0014fc00)[lVar26];
      lVar32 = lVar35 + lVar34;
      iVar29 = (int)lVar32;
      if (iVar6 < iVar29) {
        this_00 = &this->messager;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Error: the vn needed for three-particle correlation ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"is not computed, order_max = ",0x1d);
        std::ostream::operator<<(this_00,this->order_max);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"n+m = ",6);
        std::ostream::operator<<(this_00,iVar29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,". Make sure order_max > n+m!",0x1c);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"error","");
        pretty_ostream::flush(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        exit(1);
      }
      if (flag == 1) {
        if (0 < (int)uVar4) {
          dVar36 = 0.0;
          lVar22 = 0;
          dVar42 = 0.0;
          dVar38 = 0.0;
          do {
            dVar38 = dVar38 + *(double *)
                               (*(long *)((long)&(pvVar9->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar22) +
                               lVar32 * 8);
            dVar42 = dVar42 + *(double *)
                               (*(long *)((long)&(pvVar10->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar22) +
                               lVar32 * 8);
            lVar22 = lVar22 + 0x18;
          } while (lVar21 != lVar22);
          dVar40 = 0.0;
          goto LAB_0012887e;
        }
      }
      else {
        dVar36 = 0.0;
        dVar40 = 0.0;
        dVar38 = 0.0;
        dVar42 = 0.0;
        if (flag == 2) {
          if ((int)uVar4 < 1) goto LAB_00128cd5;
          lVar32 = 0;
          do {
            dVar36 = dVar36 + *(double *)
                               (*(long *)((long)&(pvVar7->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar32) +
                               (long)iVar29 * 8);
            dVar40 = dVar40 + *(double *)
                               (*(long *)((long)&(pvVar8->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar32) +
                               (long)iVar29 * 8);
            lVar32 = lVar32 + 0x18;
          } while (lVar21 != lVar32);
          dVar42 = 0.0;
        }
LAB_0012887e:
        if (0 < (int)uVar4) {
          memset(__s,0,uVar31 * 8);
          pvVar13 = (event_Q1_real->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar14 = (event_Q1_imag->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar15 = (event_Q3_real->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar32 = (long)iVar29;
          pvVar16 = (event_Q3_imag->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar17 = (event_Q2_real->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar18 = (event_Q2_imag->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar27 = -(int)(this->rapidity_dis_min / this->drap);
          lVar22 = 0;
          uVar25 = 0;
          do {
            pvVar23 = pvVar13 + uVar25;
            pvVar24 = pvVar14 + uVar25;
            lVar30 = 0;
            uVar28 = uVar27;
            do {
              if (uVar28 < uVar4) {
                if (flag == 1) {
                  pdVar33 = (pvVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  lVar19 = *(long *)&(pvVar24->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data;
                  dVar39 = 0.0;
                  if (lVar22 == lVar30 && flag_ch == 1) {
                    dVar39 = pdVar33[lVar32] * dVar38 + *(double *)(lVar19 + lVar32 * 8) * dVar42;
                  }
                  dVar41 = pdVar33[lVar34];
                  lVar20 = *(long *)((long)&(pvVar17->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + lVar30);
                  dVar37 = *(double *)(lVar20 + lVar35 * 8);
                  dVar1 = *(double *)(lVar19 + lVar34 * 8);
                  lVar19 = *(long *)((long)&(pvVar18->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + lVar30);
                  dVar2 = *(double *)(lVar19 + lVar35 * 8);
                  dVar37 = (((dVar41 * dVar37 - dVar2 * dVar1) * dVar38 +
                            (dVar2 * dVar41 + dVar37 * dVar1) * dVar42) -
                           (dVar41 * *(double *)(lVar20 + lVar34 * 8) +
                           dVar1 * *(double *)(lVar19 + lVar34 * 8))) -
                           (*(double *)
                             (*(long *)&pvVar17[uVar25].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + lVar35 * 8) *
                            *(double *)
                             (*(long *)((long)&(pvVar13->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar30) +
                             lVar35 * 8) +
                           *(double *)
                            (*(long *)&pvVar18[uVar25].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar35 * 8) *
                           *(double *)
                            (*(long *)((long)&(pvVar14->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data + lVar30) + lVar35 * 8
                            ));
                  if (1e-15 <= ABS(dVar39)) {
                    dVar37 = dVar37 - dVar39;
LAB_00128c08:
                    dVar37 = dVar37 + *pdVar33 + *pdVar33;
                  }
                }
                else {
                  if (flag != 2) goto LAB_00128c25;
                  pdVar33 = (pvVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  lVar19 = *(long *)&(pvVar24->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data;
                  dVar41 = 0.0;
                  dVar39 = 0.0;
                  if (lVar22 == lVar30) {
                    dVar39 = pdVar33[lVar35] * dVar36 + *(double *)(lVar19 + lVar35 * 8) * dVar40;
                  }
                  dVar37 = *(double *)
                            (*(long *)((long)&(pvVar15->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data + lVar30) + lVar32 * 8
                            );
                  dVar1 = *(double *)
                           (*(long *)((long)&(pvVar16->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data + lVar30) + lVar32 * 8)
                  ;
                  if (flag_ch == 1) {
                    dVar41 = pdVar33[lVar32] * dVar37 + *(double *)(lVar19 + lVar32 * 8) * dVar1;
                  }
                  dVar2 = pdVar33[lVar34];
                  dVar3 = *(double *)(lVar19 + lVar34 * 8);
                  dVar37 = ((((dVar2 * dVar36 - dVar40 * dVar3) * dVar37 +
                             (dVar2 * dVar40 + dVar36 * dVar3) * dVar1) -
                            (dVar2 * *(double *)
                                      (*(long *)((long)&(pvVar17->
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar30) +
                                      lVar34 * 8) +
                            dVar3 * *(double *)
                                     (*(long *)((long)&(pvVar18->
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar30) +
                                     lVar34 * 8))) - dVar39) - dVar41;
                  if ((1e-15 < ABS(dVar41)) && (1e-15 < ABS(dVar39))) goto LAB_00128c08;
                }
                *(double *)((long)__s + (ulong)uVar28 * 8) =
                     dVar37 + *(double *)((long)__s + (ulong)uVar28 * 8);
              }
LAB_00128c25:
              uVar28 = uVar28 - 1;
              lVar30 = lVar30 + 0x18;
            } while (lVar21 != lVar30);
            uVar25 = uVar25 + 1;
            uVar27 = uVar27 + 1;
            lVar22 = lVar22 + 0x18;
          } while (uVar25 != uVar31);
          if (0 < (int)uVar4) {
            lVar32 = *(long *)&pvVar11[lVar26].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            lVar34 = *(long *)&pvVar12[lVar26].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            uVar25 = 0;
            do {
              dVar36 = *(double *)((long)__s + uVar25 * 8);
              *(double *)(lVar32 + uVar25 * 8) = *(double *)(lVar32 + uVar25 * 8) + dVar36;
              *(double *)(lVar34 + uVar25 * 8) = dVar36 * dVar36 + *(double *)(lVar34 + uVar25 * 8);
              uVar25 = uVar25 + 1;
            } while (uVar31 != uVar25);
          }
        }
      }
LAB_00128cd5:
      lVar26 = lVar26 + 1;
    } while (lVar26 != iVar5);
  }
  operator_delete__(__s);
  return;
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_deltaeta(
    vector<vector<double>> &event_Q1_real,
    vector<vector<double>> &event_Q1_imag,
    vector<vector<double>> &event_Q2_real,
    vector<vector<double>> &event_Q2_imag,
    vector<vector<double>> &event_Q3_real,
    vector<vector<double>> &event_Q3_imag, int flag, int flag_ch,
    vector<vector<double>> &corr_rap, vector<vector<double>> &corr_rap_err) {
    // C_nmk[0] = C_000 = N(N-1)(N-2) is the number of pairs
    // C_nmk[1] = C_112, C_nmk[2] = C_123, C_nmk[3] = C_224, C_nmk[4] = C_235
    // C_nmk[5] = C_134, C_nmk[6] = C_246, C_nmk[7] = C_336, C_nmk[8] = C_347
    int n[9] = {0, 1, 1, 2, 2, 1, 2, 3, 3};
    int m[9] = {0, 1, 2, 2, 3, 3, 4, 3, 4};
    double *temp_corr = new double[N_rap];
    for (int i = 0; i < num_corr; i++) {
        int k = n[i] + m[i];
        if (k > order_max) {
            messager << "Error: the vn needed for three-particle correlation "
                     << "is not computed, order_max = " << order_max
                     << "n+m = " << k << ". Make sure order_max > n+m!";
            messager.flush("error");
            exit(1);
        }

        double Q2_real = 0.0;
        double Q2_imag = 0.0;
        double Q3_real = 0.0;
        double Q3_imag = 0.0;
        if (flag == 1) {
            for (int j = 0; j < N_rap; j++) {
                Q3_real += event_Q3_real[j][k];
                Q3_imag += event_Q3_imag[j][k];
            }
        } else if (flag == 2) {
            for (int j = 0; j < N_rap; j++) {
                Q2_real += event_Q2_real[j][k];
                Q2_imag += event_Q2_imag[j][k];
            }
        }

        for (int kk = 0; kk < N_rap; kk++) {
            temp_corr[kk] = 0.0;
        }
        for (int ii = 0; ii < N_rap; ii++) {
            for (int jj = 0; jj < N_rap; jj++) {
                int rap_idx =
                    ((ii - jj) - static_cast<int>(rapidity_dis_min / drap));
                if (rap_idx >= 0 && rap_idx < N_rap) {
                    double Qn_Qm_Qkstar = 0.0;
                    double Qn_Qnstar = 0.0;
                    double Qm_Qmstar = 0.0;
                    double Qk_Qkstar = 0.0;
                    if (flag == 1) {
                        Qn_Qm_Qkstar =
                            ((event_Q1_real[ii][n[i]] * event_Q2_real[jj][m[i]]
                              - event_Q1_imag[ii][n[i]]
                                    * event_Q2_imag[jj][m[i]])
                                 * Q3_real
                             + (event_Q1_real[ii][n[i]]
                                    * event_Q2_imag[jj][m[i]]
                                + event_Q1_imag[ii][n[i]]
                                      * event_Q2_real[jj][m[i]])
                                   * Q3_imag);
                        // full overlap between Q2 and Q3 = Q1[n]*conj(Q2[n])
                        Qn_Qnstar =
                            (event_Q1_real[ii][n[i]] * event_Q2_real[jj][n[i]]
                             + event_Q1_imag[ii][n[i]]
                                   * event_Q2_imag[jj][n[i]]);
                        // full overlap between Q1 and Q3 = Q2[m]*conj(Q1[m])
                        Qm_Qmstar =
                            (event_Q2_real[ii][m[i]] * event_Q1_real[jj][m[i]]
                             + event_Q2_imag[ii][m[i]]
                                   * event_Q1_imag[jj][m[i]]);
                        // full overlap between Q1 and Q2 = Q1[k]*conj(Q3[k])
                        if (ii == jj && flag_ch == 1) {
                            Qk_Qkstar =
                                (event_Q1_real[ii][k] * Q3_real
                                 + event_Q1_imag[ii][k] * Q3_imag);
                        }
                        double corr_local;
                        if (fabs(Qk_Qkstar) < 1e-15) {
                            corr_local = Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar;
                        } else {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar + 2. * event_Q1_real[ii][0]);
                        }
                        temp_corr[rap_idx] += corr_local;
                    } else if (flag == 2) {
                        Qn_Qm_Qkstar =
                            ((event_Q1_real[ii][n[i]] * Q2_real
                              - event_Q1_imag[ii][n[i]] * Q2_imag)
                                 * event_Q3_real[jj][k]
                             + (event_Q1_real[ii][n[i]] * Q2_imag
                                + event_Q1_imag[ii][n[i]] * Q2_real)
                                   * event_Q3_imag[jj][k]);
                        // full overlap between Q2 and Q3 = Q1[n]*conj(Q2[n])
                        Qn_Qnstar =
                            (event_Q1_real[ii][n[i]] * event_Q2_real[jj][n[i]]
                             + event_Q1_imag[ii][n[i]]
                                   * event_Q2_imag[jj][n[i]]);
                        // full overlap between Q1 and Q3 = Q2[m]*conj(Q1[m])
                        if (ii == jj) {
                            Qm_Qmstar =
                                (Q2_real * event_Q1_real[jj][m[i]]
                                 + Q2_imag * event_Q1_imag[jj][m[i]]);
                        }
                        // full overlap between Q1 and Q2 = Q1[k]*conj(Q3[k])
                        if (flag_ch == 1) {
                            Qk_Qkstar =
                                (event_Q1_real[ii][k] * event_Q3_real[jj][k]
                                 + event_Q1_imag[ii][k] * event_Q3_imag[jj][k]);
                        }

                        double corr_local;
                        if (fabs(Qk_Qkstar) > 1e-15
                            && fabs(Qm_Qmstar) > 1e-15) {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar + 2. * event_Q1_real[ii][0]);
                        } else {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar);
                        }
                        temp_corr[rap_idx] += corr_local;
                    }
                }
            }
        }
        for (int kk = 0; kk < N_rap; kk++) {
            corr_rap[i][kk] += temp_corr[kk];
            corr_rap_err[i][kk] += temp_corr[kk] * temp_corr[kk];
        }
    }
    delete[] temp_corr;
}